

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cpp
# Opt level: O0

void __thiscall ftxui::Dim::Render(Dim *this,Screen *screen)

{
  Pixel *pPVar1;
  int local_20;
  int local_1c;
  int x;
  int y;
  Screen *screen_local;
  Dim *this_local;
  
  Node::Render((Node *)this,screen);
  for (local_1c = (this->super_NodeDecorator).super_Node.box_.y_min;
      local_1c <= (this->super_NodeDecorator).super_Node.box_.y_max; local_1c = local_1c + 1) {
    for (local_20 = (this->super_NodeDecorator).super_Node.box_.x_min;
        local_20 <= (this->super_NodeDecorator).super_Node.box_.x_max; local_20 = local_20 + 1) {
      pPVar1 = Screen::PixelAt(screen,local_20,local_1c);
      pPVar1->field_0x28 = pPVar1->field_0x28 & 0xfb | 4;
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    Node::Render(screen);
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y).dim = true;
      }
    }
  }